

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestRepeatedString::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  TestRepeatedString **v1;
  TestRepeatedString **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestRepeatedString *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestRepeatedString *from;
  TestRepeatedString *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestRepeatedString *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestRepeatedString *)to_msg;
  _this = (TestRepeatedString *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRepeatedString_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestRepeatedString*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestRepeatedString_const*,proto2_unittest::TestRepeatedString*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
               ,0x9cf9,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  pRVar2 = _internal_mutable_repeated_string1_abi_cxx11_(from);
  pRVar3 = _internal_repeated_string1_abi_cxx11_
                     ((TestRepeatedString *)absl_log_internal_check_op_result);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar2,pRVar3);
  pRVar2 = _internal_mutable_repeated_string2_abi_cxx11_(from);
  pRVar3 = _internal_repeated_string2_abi_cxx11_
                     ((TestRepeatedString *)absl_log_internal_check_op_result);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar2,pRVar3);
  pRVar2 = _internal_mutable_repeated_bytes11_abi_cxx11_(from);
  pRVar3 = _internal_repeated_bytes11_abi_cxx11_
                     ((TestRepeatedString *)absl_log_internal_check_op_result);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar2,pRVar3);
  pRVar2 = _internal_mutable_repeated_bytes12_abi_cxx11_(from);
  pRVar3 = _internal_repeated_bytes12_abi_cxx11_
                     ((TestRepeatedString *)absl_log_internal_check_op_result);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar2,pRVar3);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestRepeatedString::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRepeatedString*>(&to_msg);
  auto& from = static_cast<const TestRepeatedString&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRepeatedString)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_string1()->MergeFrom(from._internal_repeated_string1());
  _this->_internal_mutable_repeated_string2()->MergeFrom(from._internal_repeated_string2());
  _this->_internal_mutable_repeated_bytes11()->MergeFrom(from._internal_repeated_bytes11());
  _this->_internal_mutable_repeated_bytes12()->MergeFrom(from._internal_repeated_bytes12());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}